

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void YUY2ToYRow_C(uint8_t *src_yuy2,uint8_t *dst_y,int width)

{
  ulong uVar1;
  
  if (1 < width) {
    uVar1 = 0;
    do {
      dst_y[uVar1] = *src_yuy2;
      dst_y[uVar1 + 1] = src_yuy2[2];
      src_yuy2 = src_yuy2 + 4;
      uVar1 = uVar1 + 2;
    } while (uVar1 < ((long)width - 1U & 0xffffffff));
  }
  if ((width & 1U) != 0) {
    dst_y[(long)width - 1U] = *src_yuy2;
  }
  return;
}

Assistant:

void YUY2ToYRow_C(const uint8_t* src_yuy2, uint8_t* dst_y, int width) {
  // Output a row of Y values.
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_y[x] = src_yuy2[0];
    dst_y[x + 1] = src_yuy2[2];
    src_yuy2 += 4;
  }
  if (width & 1) {
    dst_y[width - 1] = src_yuy2[0];
  }
}